

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>(longdouble x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int extraout_var;
  double __value;
  longdouble in_stack_00000008;
  dummy_int local_20;
  longdouble local_18;
  bool local_1;
  
  local_18 = in_stack_00000008;
  bVar1 = fmt::v5::internal::const_check<bool>(true);
  if (bVar1) {
    uVar2 = isinf(__value);
    local_1 = (uVar2 & 1) != 0;
  }
  else {
    local_20.data[0] = fmt::v5::internal::_finite((double)local_18);
    local_20.data[1] = extraout_var;
    iVar3 = fmt::v5::internal::dummy_int::operator_cast_to_int(&local_20);
    local_1 = iVar3 == 0;
  }
  return local_1;
}

Assistant:

static bool isinfinity(T x) {
    using namespace fmt::internal;
    // The resolution "priority" is:
    // isinf macro > std::isinf > ::isinf > fmt::internal::isinf
    if (const_check(sizeof(isinf(x)) != sizeof(fmt::internal::dummy_int)))
      return isinf(x) != 0;
    return !_finite(static_cast<double>(x));
  }